

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Return * __thiscall Parser::return_stmt(Parser *this)

{
  Return *in_RAX;
  Token *pTVar1;
  Expr *pEVar2;
  pointer *__ptr;
  bool bVar3;
  
  std::make_unique<Return>();
  pTVar1 = next_token(this);
  if (pTVar1->kind == Eof) goto LAB_0010d30d;
  pTVar1 = this->tok;
  if ((pTVar1->kind == Punctuator) && (pTVar1->i == 0x3b)) {
    bVar3 = false;
LAB_0010d2fa:
    if (pTVar1->i == 0x3b) {
      next_token(this);
    }
  }
  else {
    pEVar2 = additive_expression(this);
    in_RAX->expr = pEVar2;
    bVar3 = pEVar2 == (Expr *)0x0;
    pTVar1 = this->tok;
    if (pTVar1->kind == Punctuator) goto LAB_0010d2fa;
  }
  if (!bVar3) {
    return in_RAX;
  }
LAB_0010d30d:
  error<char_const(&)[49]>(this,(char (*) [49])"expecting \';\' or expression for return statement")
  ;
  return in_RAX;
}

Assistant:

Return* Parser::return_stmt()
{
  auto r = std::make_unique<Return>();
  bool err = false;

  if (next_token().kind != TokenKind::Eof) {
    if (!is_punctuator(';')) {
      r->expr = expression();
      if (!r->expr)
        err = true;
    }
    if (is_punctuator(';')) {
      next_token(); // Skip ';', return with expression
    }
  }
  else
    err = true;

  if (err)
    error("expecting ';' or expression for return statement");

  return r.release();
}